

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitIfStatement(CodegenVisitor *this,IfStatement *ifStmt)

{
  undefined8 uVar1;
  long lVar2;
  long *plVar3;
  SQInteger arg2;
  Statement *pSVar4;
  IfStatement *in_RSI;
  SQFuncState *in_RDI;
  SQInteger oldouters;
  SQInteger jmppos;
  SQInteger endifblock;
  SQInteger jnepos;
  SQScope __oldscope__;
  SQObjectPtr *in_stack_ffffffffffffff50;
  CodegenVisitor *in_stack_ffffffffffffff58;
  SQInteger arg3;
  SQFuncState *in_stack_ffffffffffffff60;
  SQInteger in_stack_ffffffffffffff68;
  SQInteger in_stack_ffffffffffffff70;
  SQInteger pos;
  SQOpcode _op;
  SQAllocContext *n;
  SQFuncState *this_00;
  SQLocalVarInfo *local_28;
  SQAllocContext pSStack_20;
  IfStatement *local_10;
  
  local_10 = in_RSI;
  addLineNumber((CodegenVisitor *)in_stack_ffffffffffffff60,(Statement *)in_stack_ffffffffffffff58);
  local_28 = *(SQLocalVarInfo **)&(in_RDI->_vlocals)._size;
  pSStack_20 = (SQAllocContext)(in_RDI->_targetstack)._vals;
  uVar1 = *(undefined8 *)(in_RDI->_returnexp + 0x1d0);
  (in_RDI->_vlocals)._size = (int)uVar1;
  (in_RDI->_vlocals)._allocated = (int)((ulong)uVar1 >> 0x20);
  plVar3 = (long *)SQFuncState::GetStackSize((SQFuncState *)0x1c238a);
  (in_RDI->_targetstack)._vals = plVar3;
  n = &(in_RDI->_targetstack)._alloc_ctx;
  this_00 = (SQFuncState *)&stack0xffffffffffffffc8;
  ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff50);
  sqvector<SQObjectPtr,_unsigned_int>::push_back
            ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_ffffffffffffff60,
             (SQObjectPtr *)in_stack_ffffffffffffff58);
  ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff50);
  IfStatement::condition(local_10);
  visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff60,(Node *)in_stack_ffffffffffffff58);
  pos = in_RDI->_returnexp;
  SQFuncState::PopTarget(in_stack_ffffffffffffff60);
  SQFuncState::AddInstruction
            (in_RDI,(SQOpcode)((ulong)pos >> 0x20),in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,(SQInteger)in_stack_ffffffffffffff60,
             (SQInteger)in_stack_ffffffffffffff58);
  arg2 = SQFuncState::GetCurrentPos((SQFuncState *)0x1c242b);
  IfStatement::thenBranch(local_10);
  Node::visit<SQCompilation::CodegenVisitor>
            ((Node *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SQFuncState::GetCurrentPos((SQFuncState *)0x1c2458);
  pSVar4 = IfStatement::elseBranch(local_10);
  if (pSVar4 != (Statement *)0x0) {
    SQFuncState::AddInstruction
              (in_RDI,(SQOpcode)((ulong)pos >> 0x20),in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,(SQInteger)in_stack_ffffffffffffff60,
               (SQInteger)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff70 = SQFuncState::GetCurrentPos((SQFuncState *)0x1c24a3);
    IfStatement::elseBranch(local_10);
    Node::visit<SQCompilation::CodegenVisitor>
              ((Node *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff68 = in_RDI->_returnexp;
    SQFuncState::GetCurrentPos((SQFuncState *)0x1c24e3);
    SQFuncState::SetInstructionParam(in_RDI,pos,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
    ;
  }
  arg3 = in_RDI->_returnexp;
  IfStatement::elseBranch(local_10);
  SQFuncState::SetInstructionParam(in_RDI,pos,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  _op = (SQOpcode)((ulong)pos >> 0x20);
  lVar2 = *(long *)(in_RDI->_returnexp + 0x1d0);
  plVar3 = (long *)SQFuncState::GetStackSize((SQFuncState *)0x1c25a2);
  if ((plVar3 != (in_RDI->_targetstack)._vals) &&
     (SQFuncState::SetStackSize(this_00,(SQInteger)n),
     lVar2 != *(long *)(in_RDI->_returnexp + 0x1d0))) {
    SQFuncState::AddInstruction
              (in_RDI,_op,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,arg2,arg3);
  }
  *(SQLocalVarInfo **)&(in_RDI->_vlocals)._size = local_28;
  (in_RDI->_targetstack)._vals = (long *)pSStack_20;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back((sqvector<SQObjectPtr,_unsigned_int> *)0x1c2620);
  return;
}

Assistant:

void CodegenVisitor::visitIfStatement(IfStatement *ifStmt) {
    addLineNumber(ifStmt);
    BEGIN_SCOPE();

    visitForceGet(ifStmt->condition());

    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jnepos = _fs->GetCurrentPos();

    ifStmt->thenBranch()->visit(this);

    SQInteger endifblock = _fs->GetCurrentPos();

    if (ifStmt->elseBranch()) {
        _fs->AddInstruction(_OP_JMP);
        SQInteger jmppos = _fs->GetCurrentPos();
        ifStmt->elseBranch()->visit(this);
        _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    }

    _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (ifStmt->elseBranch() ? 1 : 0));
    END_SCOPE();
}